

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

_Bool isKnownKeyValueString(char *key)

{
  int iVar1;
  _Bool _Var2;
  
  iVar1 = strcmp(key,"KTXorientation");
  _Var2 = true;
  if (iVar1 != 0) {
    iVar1 = strcmp(key,"KTXswizzle");
    if (iVar1 != 0) {
      iVar1 = strcmp(key,"KTXwriter");
      if (iVar1 != 0) {
        iVar1 = strcmp(key,"KTXwriterScParams");
        if (iVar1 != 0) {
          iVar1 = strcmp(key,"KTXastcDecodeMode");
          _Var2 = iVar1 == 0;
        }
      }
    }
  }
  return _Var2;
}

Assistant:

bool isKnownKeyValueString(const char* key) {
    if (strcmp(key, "KTXorientation") == 0)
        return true;
    if (strcmp(key, "KTXswizzle") == 0)
        return true;
    if (strcmp(key, "KTXwriter") == 0)
        return true;
    if (strcmp(key, "KTXwriterScParams") == 0)
        return true;
    if (strcmp(key, "KTXastcDecodeMode") == 0)
        return true;

    return false;
}